

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjPlaneHeight(int componentID,int height,int subsamp)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long *in_FS_OFFSET;
  int retval;
  int nc;
  int ph;
  uint local_18;
  
  if (((in_ESI < 1) || (in_EDX < 0)) || (5 < in_EDX)) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjPlaneHeight(): Invalid argument");
    local_18 = 0xffffffff;
  }
  else {
    iVar1 = 3;
    if (in_EDX == 3) {
      iVar1 = 1;
    }
    if ((in_EDI < 0) || (iVar1 <= in_EDI)) {
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjPlaneHeight(): Invalid argument");
      local_18 = 0xffffffff;
    }
    else {
      local_18 = (in_ESI + tjMCUHeight[in_EDX] / 8) - 1U &
                 (tjMCUHeight[in_EDX] / 8 - 1U ^ 0xffffffff);
      if (in_EDI != 0) {
        local_18 = (int)(local_18 << 3) / tjMCUHeight[in_EDX];
      }
    }
  }
  return local_18;
}

Assistant:

DLLEXPORT int tjPlaneHeight(int componentID, int height, int subsamp)
{
  int ph, nc, retval = 0;

  if (height < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneHeight(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneHeight(): Invalid argument");

  ph = PAD(height, tjMCUHeight[subsamp] / 8);
  if (componentID == 0)
    retval = ph;
  else
    retval = ph * 8 / tjMCUHeight[subsamp];

bailout:
  return retval;
}